

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

Var Js::GlobalObject::EntryCollectGarbage(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  Recycler *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  double dVar5;
  uint in_stack_00000010;
  undefined1 local_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (DAT_01459484 == '\x01') {
    Output::Print(L"MemoryTrace: GlobalObject::EntryCollectGarbage Invoke\n");
    Output::Flush();
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x604,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a26efa;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = pSVar1->recycler;
  if (this != (Recycler *)0x0) {
    if (callInfo._0_4_ != in_stack_00000010) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x60c,
                                  "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)"
                                  ,"*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo"
                                 );
      if (!bVar3) {
LAB_00a26efa:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    ArgumentReader::ArgumentReader
              ((ArgumentReader *)local_48,(CallInfo *)&args.super_Arguments.Values,
               (Var *)&stack0x00000018);
    if ((local_48._0_4_ & 0xfffffe) != 0) {
      aValue = Arguments::operator[]((Arguments *)local_48,1);
      dVar5 = JavascriptConversion::ToNumber
                        (aValue,(((((function->type).ptr)->javascriptLibrary).ptr)->
                                super_JavascriptLibraryBase).scriptContext.ptr);
      if ((dVar5 == 1.0) && (!NAN(dVar5))) {
        this->dumpObjectOnceOnCollect = true;
      }
    }
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)3221524480>(this);
  }
  if (DAT_01459484 == '\x01') {
    Output::Print(L"MemoryTrace: GlobalObject::EntryCollectGarbage Exit\n");
    Output::Flush();
  }
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
}

Assistant:

Var GlobalObject::EntryCollectGarbage(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: GlobalObject::EntryCollectGarbage Invoke\n"));
            Output::Flush();
        }
#endif

#if DBG
        // Clear 1K of stack to avoid false positive in debug build.
        // Because we don't debug build don't stack pack
        DebugClearStack();
#endif
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        Recycler* recycler = scriptContext->GetRecycler();
        if (recycler)
        {
#if DBG && defined(RECYCLER_DUMP_OBJECT_GRAPH)
            ARGUMENTS(args, callInfo);
            if (args.Info.Count > 1)
            {
                double value = JavascriptConversion::ToNumber(args[1], function->GetScriptContext());
                if (value == 1.0)
                {
                    recycler->dumpObjectOnceOnCollect = true;
                }
            }
#endif
            recycler->CollectNow<CollectNowDecommitNowExplicit>();
        }

#if DBG_DUMP
        if (Js::Configuration::Global.flags.TraceWin8Allocations)
        {
            Output::Print(_u("MemoryTrace: GlobalObject::EntryCollectGarbage Exit\n"));
            Output::Flush();
        }
#endif

        return scriptContext->GetLibrary()->GetUndefined();
    }